

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall kratos::VarUnusedVisitor::visit(VarUnusedVisitor *this,Generator *generator)

{
  char cVar1;
  long lVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  string local_b8 [32];
  undefined1 local_98 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  vars;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars_to_remove;
  
  if (((generator->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (generator->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && ((generator->is_external_ & 1U) == 0)) {
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&vars_to_remove;
    vars_to_remove._M_t._M_impl._0_4_ = 0;
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                *)local_98,&(generator->vars_)._M_t);
    vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count =
         vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x48;
    for (p_Var4 = vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var4 != (_Rb_tree_node_base *)&vars; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4))
    {
      if ((int)(*(long **)(p_Var4 + 2))[0x2d] == 0) {
        cVar1 = (**(code **)(**(long **)(p_Var4 + 2) + 0xe8))();
        if (cVar1 == '\0') {
          lVar2 = (**(code **)(**(long **)(p_Var4 + 2) + 0x70))();
          if (*(long *)(lVar2 + 0x18) == 0) {
            lVar2 = (**(code **)(**(long **)(p_Var4 + 2) + 0x80))();
            if (*(long *)(lVar2 + 0x18) == 0) {
              cVar1 = (**(code **)(**(long **)(p_Var4 + 2) + 0xe8))();
              if (cVar1 == '\0') {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_emplace_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var4 + 1));
                goto LAB_0044d991;
              }
            }
            std::mutex::lock((mutex *)vars_to_remove._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
            poVar3 = std::operator<<((ostream *)&std::cerr,"Variable: ");
            (**(code **)(**(long **)(p_Var4 + 2) + 0xf8))(local_b8);
            poVar3 = std::operator<<(poVar3,local_b8);
            poVar3 = std::operator<<(poVar3," has no sink");
            std::endl<char,std::char_traits<char>>(poVar3);
            std::__cxx11::string::~string(local_b8);
            print_ast_node(*(IRNode **)(p_Var4 + 2));
            pthread_mutex_unlock
                      ((pthread_mutex_t *)
                       vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
        }
      }
LAB_0044d991:
    }
    for (p_Var4 = vars_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var4 != (_Rb_tree_node_base *)&vars_to_remove;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      Generator::remove_var(generator,(string *)(p_Var4 + 1));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                 *)local_98);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (generator->external()) return;
        std::set<std::string> vars_to_remove;
        auto vars = generator->vars();
        for (auto const& [var_name, var] : vars) {
            if (var->type() != VarType::Base || var->is_interface()) continue;
            if (var->sinks().empty()) {
                if (var->sources().empty() && !var->is_interface()) {
                    vars_to_remove.emplace(var_name);
                } else {
                    // print out warnings
                    error_mutex_.lock();
                    std::cerr << "Variable: " << var->to_string() << " has no sink" << std::endl;
                    print_ast_node(var.get());
                    error_mutex_.unlock();
                }
            }
        }

        // remove unused vars
        for (auto const& var_name : vars_to_remove) {
            generator->remove_var(var_name);
        }
    }